

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O2

bool sptk::ReadStream(SymmetricMatrix *matrix_to_read,istream *input_stream)

{
  double dVar1;
  uint num_row;
  bool bVar2;
  double *pdVar3;
  long lVar4;
  int j;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  Row local_88;
  Matrix matrix;
  
  if (matrix_to_read == (SymmetricMatrix *)0x0) {
    bVar2 = false;
  }
  else {
    num_row = matrix_to_read->num_dimension_;
    Matrix::Matrix(&matrix,num_row,num_row);
    bVar2 = ReadStream(&matrix,input_stream);
    if (bVar2) {
      uVar6 = 0;
      uVar7 = (ulong)num_row;
      if ((int)num_row < 1) {
        uVar7 = uVar6;
      }
      lVar4 = 1;
      for (; uVar6 != uVar7; uVar6 = uVar6 + 1) {
        for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
          dVar1 = matrix.index_.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar6][lVar5];
          local_88._vptr_Row = (_func_int **)&PTR__Row_0010fd00;
          local_88.row_ = (int)uVar6;
          local_88.matrix_ = matrix_to_read;
          pdVar3 = SymmetricMatrix::Row::operator[](&local_88,(int)lVar5);
          *pdVar3 = dVar1;
        }
        lVar4 = lVar4 + 1;
      }
    }
    Matrix::~Matrix(&matrix);
  }
  return bVar2;
}

Assistant:

bool ReadStream(sptk::SymmetricMatrix* matrix_to_read,
                std::istream* input_stream) {
  if (NULL == matrix_to_read) {
    return false;
  }

  const int dim(matrix_to_read->GetNumDimension());
  sptk::Matrix matrix(dim, dim);
  if (!sptk::ReadStream(&matrix, input_stream)) {
    return false;
  }

  for (int i(0); i < dim; ++i) {
    for (int j(0); j <= i; ++j) {
      (*matrix_to_read)[i][j] = matrix[i][j];
    }
  }

  return true;
}